

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapcache.cpp
# Opt level: O0

bool __thiscall QPMCache::insert(QPMCache *this,QString *key,QPixmap *pixmap,int cost)

{
  byte bVar1;
  undefined4 in_ECX;
  QHash<QString,_QPixmapCache::Key> *in_RDX;
  QString *in_RSI;
  QPMCache *in_RDI;
  long in_FS_OFFSET;
  Key k;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffec;
  Key this_00;
  QPMCache *this_01;
  
  this_01 = *(QPMCache **)(in_FS_OFFSET + 0x28);
  remove(in_RDI,(char *)in_RSI);
  this_00.d = (KeyData *)&DAT_aaaaaaaaaaaaaaaa;
  insert(this_01,(QPixmap *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffffec);
  bVar1 = QPixmapCache::Key::isValid((Key *)&stack0xfffffffffffffff0);
  if ((bool)bVar1) {
    QString::operator=(&(this_00.d)->stringKey,in_RSI);
    QHash<QString,_QPixmapCache::Key>::operator[]
              (in_RDX,(QString *)CONCAT44(in_ECX,in_stack_ffffffffffffffc8));
    QPixmapCache::Key::operator=
              ((Key *)in_RDI,(Key *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
  }
  QPixmapCache::Key::~Key((Key *)in_RDI);
  if (*(QPMCache **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool QPMCache::insert(const QString& key, const QPixmap &pixmap, int cost)
{
    //If for the same key we add already a pixmap we should delete it
    remove(key);

    // this will create a new key; the old one has been removed
    auto k = insert(pixmap, cost);
    if (k.isValid()) {
        k.d->stringKey = key;
        cacheKeys[key] = std::move(k);
        return true;
    }
    return false;
}